

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphInternal.h
# Opt level: O2

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>::operator()
          (PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset> *this,string *macroNamespace,
          string *macroName,string *macroOut,int version)

{
  bool bVar1;
  string sStack_48;
  
  if (macroNamespace->_M_string_length != 0) {
    return Ignore;
  }
  bVar1 = std::operator==(macroName,"presetName");
  if (bVar1) {
    std::__cxx11::string::append((string *)macroOut);
  }
  else {
    bVar1 = std::operator==(macroName,"generator");
    if (bVar1) {
      if ((this->Preset->super_Preset).Hidden != false) {
        return Ok;
      }
      cmCMakePresetsGraph::GetGeneratorForPreset
                (&sStack_48,this->Graph,&(this->Preset->super_Preset).Name);
      std::__cxx11::string::append((string *)macroOut);
      std::__cxx11::string::~string((string *)&sStack_48);
      return Ok;
    }
    bVar1 = std::operator==(macroName,"fileDir");
    if (!bVar1) {
      return Ignore;
    }
    if (version < 4) {
      return Error;
    }
    cmsys::SystemTools::GetParentDirectory
              (&sStack_48,&((this->Preset->super_Preset).OriginFile)->Filename);
    std::__cxx11::string::append((string *)macroOut);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return Ok;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace.empty()) {
      if (macroName == "presetName") {
        macroOut += Preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!Preset.Hidden) {
          macroOut += Graph.GetGeneratorForPreset(Preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(Preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
    }
    return ExpandMacroResult::Ignore;
  }